

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb_fastpforlib::internal::__fastunpack4(uint8_t *in,uint8_t *out)

{
  uint8_t inwordpointer;
  uint8_t outer;
  uint8_t *out_local;
  uint8_t *in_local;
  
  out_local = out;
  in_local = in;
  for (outer = '\0'; outer < 4; outer = outer + '\x01') {
    for (inwordpointer = '\0'; inwordpointer < 8; inwordpointer = inwordpointer + '\x04') {
      *out_local = (byte)((int)(uint)*in_local >> (inwordpointer & 0x1f)) & 0xf;
      out_local = out_local + 1;
    }
    in_local = in_local + 1;
  }
  return;
}

Assistant:

void __fastunpack4(const uint8_t *__restrict in, uint8_t *__restrict out) {
	for (uint8_t outer = 0; outer < 4; ++outer) {
		for (uint8_t inwordpointer = 0; inwordpointer < 8; inwordpointer += 4)
			*(out++) = ((*in) >> inwordpointer) % (1U << 4);
		++in;
	}
}